

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createGenericReferenceType(sysbvm_context_t *context,sysbvm_tuple_t baseType)

{
  sysbvm_object_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t local_28;
  undefined8 local_20;
  
  sVar2 = (context->roots).genericAddressSpaceType;
  if (*(long *)(sVar2 + 0x78) == 0) {
    psVar1 = sysbvm_context_allocatePointerTuple(context,sVar2,0);
    *(sysbvm_object_tuple_t **)(sVar2 + 0x78) = psVar1;
  }
  local_20 = *(undefined8 *)(sVar2 + 0x78);
  local_28 = baseType;
  sVar2 = sysbvm_function_apply(context,(context->roots).referenceTypeTemplate,2,&local_28,0);
  return sVar2;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createGenericReferenceType(sysbvm_context_t *context, sysbvm_tuple_t baseType)
{
    return sysbvm_type_createReferenceType(context, baseType, sysbvm_genericAddressSpace_uniqueInstance(context));
}